

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp insert_free_var(sexp ctx,sexp x,sexp fv)

{
  sexp psVar1;
  sexp psVar2;
  
  if (((ulong)fv & 3) == 0) {
    psVar2 = fv;
    do {
      if (psVar2->tag != 6) break;
      psVar1 = (psVar2->value).type.name;
      if (((x->value).type.name == (psVar1->value).type.name) &&
         ((((x->value).type.cpl)->value).type.cpl == (((psVar1->value).type.cpl)->value).type.cpl))
      {
        return fv;
      }
      psVar2 = (psVar2->value).type.cpl;
    } while (((ulong)psVar2 & 3) == 0);
  }
  psVar2 = sexp_cons_op(ctx,(sexp)0x0,2,x,fv);
  return psVar2;
}

Assistant:

static sexp insert_free_var (sexp ctx, sexp x, sexp fv) {
  sexp name=sexp_ref_name(x), loc=sexp_ref_loc(x), ls;
  for (ls=fv; sexp_pairp(ls); ls=sexp_cdr(ls))
    if ((name == sexp_ref_name(sexp_car(ls)))
        && (loc == sexp_ref_loc(sexp_car(ls))))
      return fv;
  return sexp_cons(ctx, x, fv);
}